

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

HRESULT __thiscall
Js::ScriptContext::SerializeParserState
          (ScriptContext *this,byte *script,size_t cb,SRCINFO *pSrcInfo,CompileScriptException *pse,
          Utf8SourceInfo **ppSourceInfo,char16 *rootDisplayName,LoadScriptFlag loadScriptFlag,
          byte **buffer,DWORD *bufferSize,ArenaAllocator *alloc,JavascriptFunction **function,
          Var scriptSource)

{
  Utf8SourceInfo *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  JavascriptFunction *this_01;
  FunctionBody *function_00;
  size_t sVar5;
  LPCUTF8 utf8Source;
  SRCINFO *srcInfo;
  HRESULT HVar6;
  HRESULT hr;
  undefined1 local_af8 [8];
  Parser parser;
  AutoDynamicCodeReference local_48;
  AutoDynamicCodeReference dynamicFunctionReference;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  parser._2720_8_ = cb;
  dynamicFunctionReference.m_scriptContext = (ScriptContext *)pse;
  if (this->threadContext->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x9c5,"(!this->threadContext->IsScriptActive())",
                                "!this->threadContext->IsScriptActive()");
    if (!bVar2) goto LAB_006eed6c;
    *puVar4 = 0;
  }
  if (dynamicFunctionReference.m_scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x9c6,"(pse != nullptr)","pse != nullptr");
    if (!bVar2) goto LAB_006eed6c;
    *puVar4 = 0;
  }
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x9c7,"(alloc != nullptr)","alloc != nullptr");
    if (!bVar2) goto LAB_006eed6c;
    *puVar4 = 0;
  }
  if (function == (JavascriptFunction **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x9c8,"(function != nullptr)","function != nullptr");
    if (!bVar2) {
LAB_006eed6c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  *function = (JavascriptFunction *)0x0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  local_48.m_scriptContext = this;
  JavascriptLibrary::BeginDynamicFunctionReferences
            ((this->super_ScriptContextBase).javascriptLibrary);
  Parser::Parser((Parser *)local_af8,this,0,(PageAllocator *)0x0,false,0xaa8);
  this_01 = LoadScriptInternal(this,(Parser *)local_af8,script,parser._2720_8_,pSrcInfo,
                               (CompileScriptException *)dynamicFunctionReference.m_scriptContext,
                               ppSourceInfo,rootDisplayName,loadScriptFlag,scriptSource);
  *function = this_01;
  if (this_01 == (JavascriptFunction *)0x0) {
    hr = -0x7fffbffb;
  }
  else {
    function_00 = JavascriptFunction::GetFunctionBody(this_01);
    this_00 = (function_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    sVar5 = Utf8SourceInfo::GetCbLength(this_00,L"JsSerializeParserState");
    utf8Source = Utf8SourceInfo::GetSource(this_00,L"JsSerializeParserState");
    srcInfo = FunctionProxy::GetHostSrcInfo((FunctionProxy *)function_00);
    uVar3 = ByteCodeSerializer::SerializeToBuffer
                      (this,alloc,(DWORD)sVar5,utf8Source,function_00,srcInfo,buffer,bufferSize,4);
    this = (ScriptContext *)(ulong)uVar3;
    hr = 0;
  }
  Parser::~Parser((Parser *)local_af8);
  AutoDynamicCodeReference::~AutoDynamicCodeReference(&local_48);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  HVar6 = (HRESULT)this;
  if (this_01 == (JavascriptFunction *)0x0) {
    CompileScriptException::ProcessError
              ((CompileScriptException *)dynamicFunctionReference.m_scriptContext,(IScanner *)0x0,hr
               ,(ParseNode *)0x0,L"",L"");
    HVar6 = hr;
  }
  return HVar6;
}

Assistant:

HRESULT ScriptContext::SerializeParserState(const byte* script, size_t cb,
        SRCINFO const * pSrcInfo, CompileScriptException * pse, Utf8SourceInfo** ppSourceInfo,
        const char16 *rootDisplayName, LoadScriptFlag loadScriptFlag, byte** buffer,
        DWORD* bufferSize, ArenaAllocator* alloc, JavascriptFunction** function, Js::Var scriptSource)
    {
        Assert(!this->threadContext->IsScriptActive());
        Assert(pse != nullptr);
        Assert(alloc != nullptr);
        Assert(function != nullptr);

        *function = nullptr;
        HRESULT hr = NOERROR;

        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            Js::AutoDynamicCodeReference dynamicFunctionReference(this);
            Parser parser(this);
            *function = LoadScriptInternal(&parser, script, cb, pSrcInfo, pse, ppSourceInfo, rootDisplayName, loadScriptFlag, scriptSource);

            if (*function != nullptr)
            {
                Js::FunctionBody *functionBody = (*function)->GetFunctionBody();
                const Js::Utf8SourceInfo *sourceInfo = functionBody->GetUtf8SourceInfo();
                size_t cSourceCodeLength = sourceInfo->GetCbLength(_u("JsSerializeParserState"));
                LPCUTF8 utf8Code = sourceInfo->GetSource(_u("JsSerializeParserState"));
                DWORD dwFlags = GENERATE_BYTE_CODE_PARSER_STATE;

                return Js::ByteCodeSerializer::SerializeToBuffer(this,
                    alloc, static_cast<DWORD>(cSourceCodeLength), utf8Code,
                    functionBody, functionBody->GetHostSrcInfo(), buffer,
                    bufferSize, dwFlags);
            }
            else
            {
                hr = E_FAIL;
            }
        }
        catch (Js::OutOfMemoryException)
        {
            hr = E_OUTOFMEMORY;
        }
        catch (Js::StackOverflowException)
        {
            hr = VBSERR_OutOfStack;
        }
        pse->ProcessError(nullptr, hr, nullptr);
        return hr;
    }